

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O3

int __thiscall CVmFormatter::parse_color_attr(CVmFormatter *this,wchar_t *val,os_color_t *result)

{
  int iVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t ch;
  uint uVar4;
  os_color_t oVar5;
  color_tbl_t *pcVar6;
  
  if (*val == L'#') {
    ch = val[1];
    if ((uint)(ch + L'\xffffff80') < 0xffffff81) {
      oVar5 = 0;
    }
    else {
      pwVar3 = val + 2;
      uVar4 = 0;
      do {
        if (((uint)(ch + L'\xffffffc6') < 0xfffffff6) &&
           ((0x25 < (uint)(ch + L'\xffffffbf') ||
            ((0x3f0000003fU >> ((ulong)(uint)(ch + L'\xffffffbf') & 0x3f) & 1) == 0)))) break;
        iVar1 = t3_get_chartype(ch);
        ch = *pwVar3;
        iVar2 = (uint)(5 < (uint)(pwVar3[-1] + L'\xffffff9f')) * 0x20 + -0x57;
        if (iVar1 == 5) {
          iVar2 = -0x30;
        }
        uVar4 = uVar4 * 0x10 + iVar2 + pwVar3[-1];
        pwVar3 = pwVar3 + 1;
      } while (0xffffff80 < (uint)(ch + L'\xffffff80'));
      oVar5 = (os_color_t)(uVar4 & 0xffffff);
    }
LAB_0023ca53:
    *result = oVar5;
    iVar1 = 1;
  }
  else {
    pwVar3 = L"black";
    pcVar6 = color_tbl;
    do {
      pcVar6 = pcVar6 + 1;
      iVar1 = CVmCaseFoldStr::wstreq(val,pwVar3);
      if (iVar1 != 0) {
        oVar5 = pcVar6[-1].color_code;
        goto LAB_0023ca53;
      }
      pwVar3 = pcVar6->name;
    } while (pwVar3 != (wchar_t *)0x0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVmFormatter::parse_color_attr(VMG_ const wchar_t *val,
                                   os_color_t *result)
{
    const color_tbl_t *p;

    /* 
     *   if the value starts with '#', it's a hex RGB value; otherwise, it's
     *   a color name 
     */
    if (*val == '#')
    {
        unsigned long hexval;

        /* parse the value as a hex number */
        for (hexval = 0, ++val ; *val != '\0' && is_xdigit(*val) ; ++val)
        {
            /* add this digit */
            hexval <<= 4;
            hexval += (t3_is_digit(*val)
                       ? *val - '0'
                       : *val >= 'a' && *val <= 'f'
                       ? *val - 'a' + 0x0A
                       : *val - 'A' + 0x0A);
        }

        /* 
         *   os_color_t uses the same encoding as HTML, so just return the
         *   value as given (ensuring that it doesn't overflow the 24 bits
         *   assigned to our RGB encoding) 
         */
        *result = (os_color_t)(hexval & 0x00FFFFFF);
        return TRUE;
    }
    else
    {
        /* scan the color table for a match for the name */
        for (p = color_tbl ; p->name != 0 ; ++p)
        {
            /* if the name matches, use it */
            if (CVmCaseFoldStr::wstreq(val, p->name))
            {
                /* this is the color - make it the current buffer color */
                *result = p->color_code;

                /* indicate that we found a valid color value */
                return TRUE;
            }
        }
    }

    /* indicate that we didn't find a valid color value */
    return FALSE;
}